

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observer.cc
# Opt level: O0

CoordTopocentric * __thiscall
libsgp4::Observer::GetLookAngle(CoordTopocentric *__return_storage_ptr__,Observer *this,Eci *eci)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double rate;
  double el;
  double az;
  double top_z;
  double top_e;
  double top_s;
  double cos_theta;
  double sin_theta;
  double cos_lat;
  double sin_lat;
  double local_f0;
  double theta;
  Vector local_c8;
  undefined1 local_a8 [8];
  Vector range;
  Vector local_68;
  undefined1 local_48 [8];
  Vector range_rate;
  Eci *eci_local;
  Observer *this_local;
  
  range_rate.w = (double)Eci::GetDateTime(eci);
  Update(this,(DateTime *)&range_rate.w);
  Eci::Velocity(&local_68,eci);
  Eci::Velocity((Vector *)&range.w,(Eci *)(this + 0x18));
  Vector::operator-((Vector *)local_48,&local_68,(Vector *)&range.w);
  Eci::Position(&local_c8,eci);
  Eci::Position((Vector *)&theta,(Eci *)(this + 0x18));
  Vector::operator-((Vector *)local_a8,&local_c8,(Vector *)&theta);
  range.z = Vector::Magnitude((Vector *)local_a8);
  sin_lat = (double)Eci::GetDateTime(eci);
  local_f0 = DateTime::ToLocalMeanSiderealTime((DateTime *)&sin_lat,*(double *)(this + 8));
  dVar1 = sin(*(double *)this);
  dVar2 = cos(*(double *)this);
  dVar3 = sin(local_f0);
  dVar4 = cos(local_f0);
  dVar5 = -dVar2 * range.y + dVar1 * dVar4 * (double)local_a8 + dVar1 * dVar3 * range.x;
  el = atan(-(-dVar3 * (double)local_a8 + dVar4 * range.x) / dVar5);
  if (0.0 < dVar5) {
    el = el + 3.141592653589793;
  }
  if (el < 0.0) {
    el = el + 6.283185307179586;
  }
  dVar1 = asin((dVar1 * range.y + dVar2 * dVar4 * (double)local_a8 + dVar2 * dVar3 * range.x) /
               range.z);
  dVar2 = Vector::Dot((Vector *)local_a8,(Vector *)local_48);
  CoordTopocentric::CoordTopocentric(__return_storage_ptr__,el,dVar1,range.z,dVar2 / range.z);
  return __return_storage_ptr__;
}

Assistant:

CoordTopocentric Observer::GetLookAngle(const Eci &eci)
{
    /*
     * update the observers Eci to match the time of the Eci passed in
     * if necessary
     */
    Update(eci.GetDateTime());

    /*
     * calculate differences
     */
    Vector range_rate = eci.Velocity() - m_eci.Velocity();
    Vector range = eci.Position() - m_eci.Position();

    range.w = range.Magnitude();

    /*
     * Calculate Local Mean Sidereal Time for observers longitude
     */
    double theta = eci.GetDateTime().ToLocalMeanSiderealTime(m_geo.longitude);

    double sin_lat = sin(m_geo.latitude);
    double cos_lat = cos(m_geo.latitude);
    double sin_theta = sin(theta);
    double cos_theta = cos(theta);

    double top_s = sin_lat * cos_theta * range.x
        + sin_lat * sin_theta * range.y - cos_lat * range.z;
    double top_e = -sin_theta * range.x
        + cos_theta * range.y;
    double top_z = cos_lat * cos_theta * range.x 
        + cos_lat * sin_theta * range.y + sin_lat * range.z;
    double az = atan(-top_e / top_s);

    if (top_s > 0.0)
    {
        az += kPI;
    }

    if (az < 0.0)
    {
        az += 2.0 * kPI;
    }

    double el = asin(top_z / range.w);
    double rate = range.Dot(range_rate) / range.w;

    /*
     * azimuth in radians
     * elevation in radians
     * range in km
     * range rate in km/s
     */
    return CoordTopocentric(az,
            el,
            range.w,
            rate);
}